

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void read_num_bytes(char *buf,CVmDataSource *src,size_t len,CVmPackType *t)

{
  int iVar1;
  long in_RCX;
  ulong in_RDX;
  long *in_RSI;
  char *in_RDI;
  
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDI,in_RDX);
  if (iVar1 != 0) {
    err_throw(0);
  }
  if ((1 < in_RDX) && (*(int *)(in_RCX + 0x20) != 0)) {
    reverse_bytes(in_RDI,in_RDX);
  }
  return;
}

Assistant:

static void read_num_bytes(char *buf, CVmDataSource *src, size_t len,
                           const CVmPackType *t)
{
    /* read the bytes */
    if (src->read(buf, len))
        err_throw(VMERR_READ_FILE);

    /* 
     *   if the source is in big-endian order, swap the bytes to get our
     *   standard little-endian order 
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);
}